

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O1

int envy_bios_parse_power_fan_calib(envy_bios *bios)

{
  int iVar1;
  envy_bios_power_fan_calib_entry *peVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  
  uVar3 = (bios->power).fan_calib.offset;
  iVar6 = -0x16;
  if ((ulong)uVar3 != 0) {
    if (uVar3 < bios->length) {
      (bios->power).fan_calib.version = bios->data[uVar3];
    }
    else {
      (bios->power).fan_calib.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    if ((bios->power).fan_calib.version == '\x10') {
      uVar3 = (bios->power).fan_calib.offset + 1;
      if (uVar3 < bios->length) {
        (bios->power).fan_calib.hlen = bios->data[uVar3];
        iVar6 = 0;
      }
      else {
        (bios->power).fan_calib.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar6 = -0xe;
      }
      uVar3 = (bios->power).fan_calib.offset + 2;
      if (uVar3 < bios->length) {
        (bios->power).fan_calib.rlen = bios->data[uVar3];
        iVar4 = 0;
      }
      else {
        (bios->power).fan_calib.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar4 = -0xe;
      }
      uVar3 = (bios->power).fan_calib.offset + 3;
      if (uVar3 < bios->length) {
        (bios->power).fan_calib.entriesnum = bios->data[uVar3];
        iVar1 = 0;
      }
      else {
        (bios->power).fan_calib.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar1 = -0xe;
      }
      (bios->power).fan_calib.valid = (iVar4 == 0 && iVar6 == 0) && iVar1 == 0;
      uVar7 = (ulong)(bios->power).fan_calib.entriesnum;
      peVar2 = (envy_bios_power_fan_calib_entry *)calloc(uVar7,0x18);
      (bios->power).fan_calib.entries = peVar2;
      if (uVar7 != 0) {
        lVar5 = 0;
        uVar7 = 0;
        do {
          uVar3 = (uint)(bios->power).fan_calib.rlen * (int)uVar7 +
                  (uint)(bios->power).fan_calib.hlen + (bios->power).fan_calib.offset;
          peVar2 = (bios->power).fan_calib.entries;
          *(uint *)((long)&peVar2->offset + lVar5) = uVar3;
          if (uVar3 < bios->length) {
            (&peVar2->enable)[lVar5] = bios->data[uVar3];
          }
          else {
            (&peVar2->enable)[lVar5] = '\0';
            fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar3);
          }
          peVar2 = (bios->power).fan_calib.entries;
          if (uVar3 + 1 < bios->length) {
            (&peVar2->mode)[lVar5] = bios->data[uVar3 + 1];
          }
          else {
            (&peVar2->mode)[lVar5] = '\0';
            fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
          }
          peVar2 = (bios->power).fan_calib.entries;
          if (uVar3 + 3 < bios->length) {
            *(ushort *)((long)&peVar2->unk02 + lVar5) =
                 CONCAT11(bios->data[uVar3 + 3],bios->data[uVar3 + 2]);
          }
          else {
            *(undefined2 *)((long)&peVar2->unk02 + lVar5) = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
          }
          peVar2 = (bios->power).fan_calib.entries;
          if (uVar3 + 5 < bios->length) {
            *(ushort *)((long)&peVar2->unk04 + lVar5) =
                 CONCAT11(bios->data[uVar3 + 5],bios->data[uVar3 + 4]);
          }
          else {
            *(undefined2 *)((long)&peVar2->unk04 + lVar5) = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
          }
          peVar2 = (bios->power).fan_calib.entries;
          if (uVar3 + 7 < bios->length) {
            *(ushort *)((long)&peVar2->unk06 + lVar5) =
                 CONCAT11(bios->data[uVar3 + 7],bios->data[uVar3 + 6]);
          }
          else {
            *(undefined2 *)((long)&peVar2->unk06 + lVar5) = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
          }
          peVar2 = (bios->power).fan_calib.entries;
          if (uVar3 + 9 < bios->length) {
            *(ushort *)((long)&peVar2->pwm_freq + lVar5) =
                 CONCAT11(bios->data[uVar3 + 9],bios->data[uVar3 + 8]);
          }
          else {
            *(undefined2 *)((long)&peVar2->pwm_freq + lVar5) = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
          }
          peVar2 = (bios->power).fan_calib.entries;
          if (uVar3 + 0xb < bios->length) {
            *(ushort *)((long)&peVar2->duty_max + lVar5) =
                 CONCAT11(bios->data[uVar3 + 0xb],bios->data[uVar3 + 10]);
          }
          else {
            *(undefined2 *)((long)&peVar2->duty_max + lVar5) = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
          }
          peVar2 = (bios->power).fan_calib.entries;
          if (uVar3 + 0xd < bios->length) {
            *(ushort *)((long)&peVar2->duty_offset + lVar5) =
                 CONCAT11(bios->data[uVar3 + 0xd],bios->data[uVar3 + 0xc]);
          }
          else {
            *(undefined2 *)((long)&peVar2->duty_offset + lVar5) = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
          }
          peVar2 = (bios->power).fan_calib.entries;
          if (uVar3 + 0xf < bios->length) {
            *(ushort *)((long)&peVar2->unk0e + lVar5) =
                 CONCAT11(bios->data[uVar3 + 0xf],bios->data[uVar3 + 0xe]);
          }
          else {
            *(undefined2 *)((long)&peVar2->unk0e + lVar5) = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
          }
          if (0x11 < (bios->power).fan_calib.rlen) {
            peVar2 = (bios->power).fan_calib.entries;
            if (uVar3 + 0x11 < bios->length) {
              *(ushort *)((long)&peVar2->unk10 + lVar5) =
                   CONCAT11(bios->data[uVar3 + 0x11],bios->data[uVar3 + 0x10]);
            }
            else {
              *(undefined2 *)((long)&peVar2->unk10 + lVar5) = 0;
              fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
            }
          }
          if (0x13 < (bios->power).fan_calib.rlen) {
            peVar2 = (bios->power).fan_calib.entries;
            if (uVar3 + 0x13 < bios->length) {
              *(ushort *)((long)&peVar2->unk12 + lVar5) =
                   CONCAT11(bios->data[uVar3 + 0x13],bios->data[uVar3 + 0x12]);
            }
            else {
              *(undefined2 *)((long)&peVar2->unk12 + lVar5) = 0;
              fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
            }
          }
          uVar7 = uVar7 + 1;
          lVar5 = lVar5 + 0x18;
        } while (uVar7 < (bios->power).fan_calib.entriesnum);
      }
      iVar6 = 0;
    }
    else {
      fprintf(_stderr,"Unknown FAN CALIBRATION table version 0x%x\n");
    }
  }
  return iVar6;
}

Assistant:

int envy_bios_parse_power_fan_calib(struct envy_bios *bios) {
	struct envy_bios_power_fan_calib *fan_calib = &bios->power.fan_calib;
	int i, err = 0;

	if (!fan_calib->offset)
		return -EINVAL;

	bios_u8(bios, fan_calib->offset + 0x0, &fan_calib->version);
	switch(fan_calib->version) {
	case 0x10:
		err |= bios_u8(bios, fan_calib->offset + 0x1, &fan_calib->hlen);
		err |= bios_u8(bios, fan_calib->offset + 0x2, &fan_calib->rlen);
		err |= bios_u8(bios, fan_calib->offset + 0x3, &fan_calib->entriesnum);
		fan_calib->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown FAN CALIBRATION table version 0x%x\n", fan_calib->version);
		return -EINVAL;
	};

	err = 0;
	fan_calib->entries = calloc(fan_calib->entriesnum, sizeof(struct envy_bios_power_fan_calib_entry));
	for (i = 0; i < fan_calib->entriesnum; i++) {
		uint32_t data = fan_calib->offset + fan_calib->hlen + i * fan_calib->rlen;

		fan_calib->entries[i].offset = data;
		bios_u8(bios, data + 0x00, &fan_calib->entries[i].enable);
		bios_u8(bios, data + 0x01, &fan_calib->entries[i].mode);
		bios_u16(bios, data + 0x02, &fan_calib->entries[i].unk02);
		bios_u16(bios, data + 0x04, &fan_calib->entries[i].unk04);
		bios_u16(bios, data + 0x06, &fan_calib->entries[i].unk06);
		bios_u16(bios, data + 0x08, &fan_calib->entries[i].pwm_freq); /* not used by the blob */
		bios_u16(bios, data + 0x0a, &fan_calib->entries[i].duty_max);
		bios_u16(bios, data + 0x0c, (uint16_t*) &fan_calib->entries[i].duty_offset);
		bios_u16(bios, data + 0x0e, &fan_calib->entries[i].unk0e);

		if (fan_calib->rlen >= 0x12)
			bios_u16(bios, data + 0x10, &fan_calib->entries[i].unk10);

		if (fan_calib->rlen >= 0x14)
			bios_u16(bios, data + 0x12, &fan_calib->entries[i].unk12);
	}

	return 0;
}